

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O2

bool __thiscall flow::lang::Lexer::ipv6HexPart(Lexer *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  
  if (this->currentChar_ == 0x3a) {
    iVar3 = peekChar(this);
    if (iVar3 != 0x3a) goto LAB_0012c945;
    std::__cxx11::string::assign((char *)&this->stringValue_);
    nextChar(this,true);
    nextChar(this,true);
    bVar1 = isHexChar(this);
  }
  else {
LAB_0012c945:
    bVar2 = ipv6HexSeq(this);
    if (!bVar2) {
      bVar2 = false;
      goto LAB_0012c9ae;
    }
    bVar2 = true;
    if (this->currentChar_ != 0x3a) goto LAB_0012c9ae;
    iVar3 = peekChar(this);
    if (iVar3 != 0x3a) goto LAB_0012c9ae;
    std::__cxx11::string::append((char *)&this->stringValue_);
    nextChar(this,true);
    nextChar(this,true);
    bVar1 = isHexChar(this);
  }
  bVar2 = true;
  if (bVar1 != false) {
    bVar2 = ipv6HexSeq(this);
  }
LAB_0012c9ae:
  iVar3 = this->currentChar_;
  iVar4 = isalnum(iVar3);
  return (bool)(iVar3 != 0x3a & bVar2 & iVar4 == 0);
}

Assistant:

bool Lexer::ipv6HexPart() {
  bool rv;

  if (currentChar() == ':' && peekChar() == ':') {  // (3)
    stringValue_ = "::";
    nextChar();  // skip ':'
    nextChar();  // skip ':'
    rv = isHexChar() ? ipv6HexSeq() : true;
  } else if (!!(rv = ipv6HexSeq())) {
    if (currentChar() == ':' && peekChar() == ':') {  // (2)
      stringValue_ += "::";
      nextChar();  // skip ':'
      nextChar();  // skip ':'
      rv = isHexChar() ? ipv6HexSeq() : true;
    }
  }

  if (std::isalnum(currentChar_) || currentChar_ == ':') rv = false;

  return rv;
}